

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void vmaCalculatePoolStatistics
               (VmaAllocator allocator,VmaPool pool,VmaDetailedStatistics *pPoolStats)

{
  *(undefined8 *)((long)&(pPoolStats->statistics).blockBytes + 4) = 0;
  *(undefined8 *)((long)&(pPoolStats->statistics).allocationBytes + 4) = 0;
  (pPoolStats->statistics).blockCount = 0;
  (pPoolStats->statistics).allocationCount = 0;
  (pPoolStats->statistics).blockBytes = 0;
  pPoolStats->allocationSizeMin = 0xffffffffffffffff;
  pPoolStats->allocationSizeMax = 0;
  pPoolStats->unusedRangeSizeMin = 0xffffffffffffffff;
  pPoolStats->unusedRangeSizeMax = 0;
  VmaBlockVector::AddDetailedStatistics(&pool->m_BlockVector,pPoolStats);
  VmaDedicatedAllocationList::AddDetailedStatistics(&pool->m_DedicatedAllocations,pPoolStats);
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaCalculatePoolStatistics(
    VmaAllocator allocator,
    VmaPool pool,
    VmaDetailedStatistics* pPoolStats)
{
    VMA_ASSERT(allocator && pool && pPoolStats);

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    allocator->CalculatePoolStatistics(pool, pPoolStats);
}